

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::SpecparamSymbol::getValue(SpecparamSymbol *this,SourceRange referencingRange)

{
  DeclaredType *this_00;
  bool bVar1;
  Scope *pSVar2;
  Compilation *pCVar3;
  SyntaxNode *pSVar4;
  Type *lhs;
  Diagnostic *pDVar5;
  Expression *pEVar6;
  ConstantValue *pCVar7;
  Type *this_01;
  TypedBumpAllocator<slang::ConstantValue> *this_02;
  LookupLocation LVar8;
  SourceRange SVar9;
  SourceRange assignmentRange;
  ASTContext ctx;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff68;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_90;
  ASTContext local_68;
  
  if (this->value1 != (ConstantValue *)0x0) goto LAB_0022796f;
  pSVar2 = (this->super_ValueSymbol).super_Symbol.parentScope;
  LVar8 = LookupLocation::before((Symbol *)this);
  local_68.lookupIndex = LVar8.index;
  local_68.flags.m_bits = 0x800000000;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  bVar1 = this->evaluating;
  local_68.scope.ptr = pSVar2;
  if (bVar1 == true) {
    pDVar5 = ASTContext::addDiag(&local_68,(DiagCode)0x17000c,
                                 (this->super_ValueSymbol).super_Symbol.location);
    pDVar5 = Diagnostic::operator<<(pDVar5,(this->super_ValueSymbol).super_Symbol.name);
    Diagnostic::addNote(pDVar5,(DiagCode)0xd0001,referencingRange);
  }
  else {
    this->evaluating = true;
    this_00 = &(this->super_ValueSymbol).declaredType;
    pEVar6 = DeclaredType::getInitializer(this_00);
    if (pEVar6 == (Expression *)0x0) {
      this->value1 = (ConstantValue *)ConstantValue::Invalid;
LAB_00227953:
      this->value2 = (ConstantValue *)ConstantValue::Invalid;
    }
    else {
      pCVar3 = pSVar2->compilation;
      ASTContext::eval((ConstantValue *)&local_90,&local_68,pEVar6,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      this_02 = &pCVar3->constantAllocator;
      pCVar7 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                         (this_02,(ConstantValue *)&local_90);
      this->value1 = pCVar7;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_90);
      pSVar4 = (this->super_ValueSymbol).super_Symbol.originatingSyntax;
      lhs = *(Type **)(pSVar4 + 4);
      if (lhs == (Type *)0x0) goto LAB_00227953;
      this_01 = DeclaredType::getType(this_00);
      SVar9 = parsing::Token::range((Token *)&pSVar4[1].previewNode);
      assignmentRange.endLoc = (SourceLocation)&local_68;
      assignmentRange.startLoc = SVar9.endLoc;
      pEVar6 = Expression::bindRValue
                         ((Expression *)this_01,lhs,(ExpressionSyntax *)SVar9.startLoc,
                          assignmentRange,(ASTContext *)0x0,in_stack_ffffffffffffff68);
      ASTContext::eval((ConstantValue *)&local_90,&local_68,pEVar6,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      pCVar7 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                         (this_02,(ConstantValue *)&local_90);
      this->value2 = pCVar7;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_90);
    }
    this->evaluating = false;
  }
  if (bVar1 != false) {
    return (ConstantValue *)ConstantValue::Invalid;
  }
LAB_0022796f:
  return this->value1;
}

Assistant:

const ConstantValue& SpecparamSymbol::getValue(SourceRange referencingRange) const {
    if (!value1) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::before(*this), ASTFlags::SpecparamInitializer);

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            auto& comp = scope->getCompilation();
            value1 = comp.allocConstant(ctx.eval(*init));

            // Specparams can also be a "PATHPULSE$" which has two values to bind.
            auto syntax = getSyntax();
            SLANG_ASSERT(syntax);

            auto& decl = syntax->as<SpecparamDeclaratorSyntax>();
            if (auto exprSyntax = decl.value2) {
                auto& expr2 = Expression::bindRValue(getType(), *exprSyntax, decl.equals.range(),
                                                     ctx);
                value2 = comp.allocConstant(ctx.eval(expr2));
            }
            else {
                value2 = &ConstantValue::Invalid;
            }
        }
        else {
            value1 = &ConstantValue::Invalid;
            value2 = &ConstantValue::Invalid;
        }
    }
    return *value1;
}